

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O2

double inv_boxcox_eval(double *x,int N,double lambda,double *bxcx)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  if ((lambda != 0.0) || (NAN(lambda))) {
    dVar3 = lambda;
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dVar3 = log1p(x[uVar1] * lambda);
      dVar3 = exp(dVar3 / lambda);
      bxcx[uVar1] = dVar3;
    }
  }
  else {
    for (uVar1 = 0; dVar3 = lambda, uVar2 != uVar1; uVar1 = uVar1 + 1) {
      lambda = exp(x[uVar1]);
      bxcx[uVar1] = lambda;
    }
  }
  return dVar3;
}

Assistant:

double inv_boxcox_eval(double *x,int N, double lambda,double *bxcx) {
    int i;

    if (lambda == 0) {
        for(i = 0; i < N;++i) {
            bxcx[i] = exp(x[i]);
        }
    } else {
        for(i = 0; i < N;++i) {
            bxcx[i] = exp(log1p(lambda * x[i])/lambda);
        }
    }
}